

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall cmGeneratorTarget::TraceDependencies(cmGeneratorTarget *this)

{
  cmTargetTraceDependencies tracer;
  cmTargetTraceDependencies cStack_f8;
  
  if (this->Target->TargetTypeValue != GLOBAL_TARGET) {
    cmTargetTraceDependencies::cmTargetTraceDependencies(&cStack_f8,this);
    cmTargetTraceDependencies::Trace(&cStack_f8);
    cmTargetTraceDependencies::~cmTargetTraceDependencies(&cStack_f8);
  }
  return;
}

Assistant:

int cmGeneratorTarget::GetType() const
{
  return this->Target->GetType();
}